

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_areturn(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *pFVar1;
  Value operand;
  
  this_00 = VMStack::getInstance();
  pFVar1 = VMStack::getTopFrame(this_00);
  operand = Frame::popTopOfOperandStack(pFVar1);
  if (operand.type == REFERENCE) {
    VMStack::destroyTopFrame(this_00);
    pFVar1 = VMStack::getTopFrame(this_00);
    Frame::pushIntoOperandStack(pFVar1,operand);
    return;
  }
  __assert_fail("returnValue.type == ValueType::REFERENCE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0xdb4,"void ExecutionEngine::i_areturn()");
}

Assistant:

void ExecutionEngine::i_areturn() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    Value returnValue = topFrame->popTopOfOperandStack();
    assert(returnValue.type == ValueType::REFERENCE);
    
    stackFrame.destroyTopFrame();
    
    Frame *newTopFrame = stackFrame.getTopFrame();
    newTopFrame->pushIntoOperandStack(returnValue);
}